

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

istream * argo::operator>>(istream *stream,json *j)

{
  type other;
  undefined1 local_20 [16];
  json *j_local;
  istream *stream_local;
  
  local_20._8_8_ = j;
  j_local = (json *)stream;
  parser::parse((parser *)local_20,stream);
  other = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*
                    ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_20);
  json::operator=((json *)local_20._8_8_,other);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)local_20);
  return (istream *)j_local;
}

Assistant:

istream &NAMESPACE::operator>>(istream &stream, json &j)
{
    j = move(*parser::parse(stream));
    return stream;
}